

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugDrawCursorPos(ImU32 col)

{
  ImU32 in_EDI;
  ImVec2 *unaff_retaddr;
  ImVec2 *in_stack_00000008;
  ImDrawList *in_stack_00000010;
  ImVec2 pos;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImGuiWindow *local_18;
  ImGuiContext *local_10;
  float in_stack_fffffffffffffff8;
  
  local_10 = GImGui;
  local_18 = GImGui->CurrentWindow;
  local_20 = (local_18->DC).CursorPos;
  ImVec2::ImVec2(&local_28,local_20.x,local_20.y - 3.0);
  ImVec2::ImVec2(&local_30,local_20.x,local_20.y + 4.0);
  ImDrawList::AddLine(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_EDI,
                      in_stack_fffffffffffffff8);
  ImVec2::ImVec2(&local_38,local_20.x - 3.0,local_20.y);
  ImVec2::ImVec2(&local_40,local_20.x + 4.0,local_20.y);
  ImDrawList::AddLine(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_EDI,
                      in_stack_fffffffffffffff8);
  return;
}

Assistant:

void ImGui::DebugDrawCursorPos(ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImVec2 pos = window->DC.CursorPos;
    window->DrawList->AddLine(ImVec2(pos.x, pos.y - 3.0f), ImVec2(pos.x, pos.y + 4.0f), col, 1.0f);
    window->DrawList->AddLine(ImVec2(pos.x - 3.0f, pos.y), ImVec2(pos.x + 4.0f, pos.y), col, 1.0f);
}